

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tls.cpp
# Opt level: O3

void __thiscall xmrig::Client::Tls::Tls(Tls *this,Client *client)

{
  SSL_METHOD *meth;
  SSL_CTX *pSVar1;
  BIO_METHOD *pBVar2;
  BIO *pBVar3;
  
  memset(&this->m_ready,0,0x849);
  this->m_client = client;
  this->m_ssl = (SSL *)0x0;
  meth = (SSL_METHOD *)TLS_method();
  pSVar1 = SSL_CTX_new(meth);
  this->m_ctx = (SSL_CTX *)pSVar1;
  if (pSVar1 != (SSL_CTX *)0x0) {
    pBVar2 = BIO_s_mem();
    pBVar3 = BIO_new(pBVar2);
    this->m_writeBio = (BIO *)pBVar3;
    pBVar2 = BIO_s_mem();
    pBVar3 = BIO_new(pBVar2);
    this->m_readBio = (BIO *)pBVar3;
    SSL_CTX_set_options(this->m_ctx,0x2000000);
    return;
  }
  return;
}

Assistant:

xmrig::Client::Tls::Tls(Client *client) :
    m_ready(false),
    m_buf(),
    m_fingerprint(),
    m_client(client),
    m_ssl(nullptr)
{
    m_ctx = SSL_CTX_new(SSLv23_method());
    assert(m_ctx != nullptr);

    if (!m_ctx) {
        return;
    }

    m_writeBio = BIO_new(BIO_s_mem());
    m_readBio  = BIO_new(BIO_s_mem());
    SSL_CTX_set_options(m_ctx, SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3);
}